

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

int get_distance_bw_nodes(GridNode *a,GridNode *b)

{
  int iVar1;
  int b_00;
  int iVar2;
  int iVar3;
  int dist;
  int deltaY;
  int deltaX;
  GridNode *b_local;
  GridNode *a_local;
  
  iVar1 = absolute((a->pos).x - (b->pos).x);
  b_00 = absolute((a->pos).y - (b->pos).y);
  iVar2 = min(iVar1,b_00);
  iVar3 = max(iVar1,b_00);
  iVar1 = min(iVar1,b_00);
  return iVar2 * 0xe + (iVar3 - iVar1) * 10;
}

Assistant:

int get_distance_bw_nodes(GridNode *a, GridNode *b)
{
    int deltaX = absolute(a->pos.x - b->pos.x);
    int deltaY = absolute(a->pos.y - b->pos.y);
#if USE_ACCURATE_DIST
    int dist = (int)(sqrt((deltaX * deltaX) + (deltaY * deltaY)));
#else
    int dist = 14 * min(deltaX, deltaY) + 10 * (max(deltaX, deltaY) - min(deltaX, deltaY));
#endif
    return dist;
}